

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::ReserveKeyFromKeyPool
          (LegacyScriptPubKeyMan *this,int64_t *nIndex,CKeyPool *keypool,bool fRequestedInternal)

{
  CPubKey *this_00;
  map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_> *this_01;
  WalletStorage *pWVar1;
  size_t sVar2;
  const_iterator __position;
  byte bVar3;
  bool bVar4;
  int iVar5;
  WalletDatabase *pWVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  runtime_error *prVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *this_02;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_long>_>,_std::_Rb_tree_iterator<std::pair<const_CKeyID,_long>_>_>
  pVar14;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  CPubKey pk;
  WalletBatch local_e0;
  unique_lock<std::recursive_mutex> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_type *local_a0;
  size_type local_98;
  size_type local_90;
  undefined8 uStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *nIndex = -1;
  (keypool->vchPubKey).vch[0] = 0xff;
  local_d0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_d0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_d0);
  iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this);
  if ((char)iVar5 == '\0') {
LAB_004ec53e:
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar5 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
    bVar3 = (byte)iVar5;
  }
  else {
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar5 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
    bVar3 = 1;
    if ((char)iVar5 == '\0') goto LAB_004ec53e;
  }
  sVar2 = (this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
          _M_node_count;
  lVar11 = 0x290;
  if ((fRequestedInternal & bVar3) != 0) {
    lVar11 = 0x260;
  }
  lVar13 = 0x2c0;
  if (sVar2 == 0) {
    lVar13 = lVar11;
  }
  lVar11 = *(long *)((long)&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                            NotifyCanGetAddressesChanged.super_signal_base._vptr_signal_base +
                    lVar13);
  if (lVar11 == 0) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_d0);
  }
  else {
    iVar5 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3]
            )();
    pWVar6 = (WalletDatabase *)CONCAT44(extraout_var,iVar5);
    (*pWVar6->_vptr_WalletDatabase[0xe])(&local_e0,pWVar6,1);
    this_02 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
              ((long)&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan +
              lVar13);
    __position._M_node = *(_Base_ptr *)(this_02 + 0x18);
    *nIndex = *(int64_t *)(__position._M_node + 1);
    local_e0.m_database = pWVar6;
    std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    erase_abi_cxx11_(this_02,__position);
    bVar4 = WalletBatch::ReadPool(&local_e0,*nIndex,keypool);
    if (!bVar4) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"ReserveKeyFromKeyPool","");
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_58,": read failed");
      local_a0 = (size_type *)(pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0 == paVar12) {
        local_90 = paVar12->_M_allocated_capacity;
        uStack_88 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_a0 = &local_90;
      }
      else {
        local_90 = paVar12->_M_allocated_capacity;
      }
      local_98 = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar9,(string *)&local_a0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004ecc0d;
    }
    this_00 = &keypool->vchPubKey;
    local_a0 = (size_type *)CONCAT71(local_a0._1_7_,0xff);
    CPubKey::GetID((CKeyID *)&local_58,this_00);
    iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                      (this,&local_58,&local_a0);
    if ((char)iVar5 == '\0') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"ReserveKeyFromKeyPool","");
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_c0,": unknown key in key pool");
      local_58._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar12) {
        local_58.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_58._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar9,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004ecc0d;
    }
    if ((sVar2 == 0) && (keypool->fInternal != (bool)(fRequestedInternal & bVar3))) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"ReserveKeyFromKeyPool","");
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_c0,": keypool entry misclassified");
      local_58._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar12) {
        local_58.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_58._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar9,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004ecc0d;
    }
    bVar3 = this_00->vch[0];
    if ((((bVar3 & 0xfe) != 2) && (1 < bVar3 - 6)) && (bVar3 != 4)) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"ReserveKeyFromKeyPool","");
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_c0,": keypool entry invalid");
      local_58._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar12) {
        local_58.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_58._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar9,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004ecc0d;
    }
    sVar7 = std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
            ::count(&this->m_index_to_reserved_key,nIndex);
    if (sVar7 != 0) {
      __assert_fail("m_index_to_reserved_key.count(nIndex) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x5cc,
                    "bool wallet::LegacyScriptPubKeyMan::ReserveKeyFromKeyPool(int64_t &, CKeyPool &, bool)"
                   );
    }
    CPubKey::GetID((CKeyID *)&local_58,this_00);
    pmVar8 = std::
             map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::
             operator[](&this->m_index_to_reserved_key,nIndex);
    *(undefined4 *)((pmVar8->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
         local_58.field_2._M_allocated_capacity._0_4_;
    *(pointer *)(pmVar8->super_uint160).super_base_blob<160U>.m_data._M_elems =
         local_58._M_dataplus._M_p;
    *(size_type *)((pmVar8->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) =
         local_58._M_string_length;
    CPubKey::GetID((CKeyID *)&local_58,this_00);
    this_01 = &(this->super_LegacyDataSPKM).m_pool_key_to_index;
    pVar14 = std::
             _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
             ::equal_range(&this_01->_M_t,(key_type *)&local_58);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
    ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
    ScriptPubKeyMan::WalletLogPrintf<long>((ScriptPubKeyMan *)this,"keypool reserve %d\n",*nIndex);
    if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
        local_e0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
      (*(*(_func_int ***)
          local_e0.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_d0);
    if (lVar11 != 0) {
      boost::signals2::
      signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
      ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyCanGetAddressesChanged)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar11 != 0;
  }
LAB_004ecc0d:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ReserveKeyFromKeyPool(int64_t& nIndex, CKeyPool& keypool, bool fRequestedInternal)
{
    nIndex = -1;
    keypool.vchPubKey = CPubKey();
    {
        LOCK(cs_KeyStore);

        bool fReturningInternal = fRequestedInternal;
        fReturningInternal &= (IsHDEnabled() && m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) || m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS);
        bool use_split_keypool = set_pre_split_keypool.empty();
        std::set<int64_t>& setKeyPool = use_split_keypool ? (fReturningInternal ? setInternalKeyPool : setExternalKeyPool) : set_pre_split_keypool;

        // Get the oldest key
        if (setKeyPool.empty()) {
            return false;
        }

        WalletBatch batch(m_storage.GetDatabase());

        auto it = setKeyPool.begin();
        nIndex = *it;
        setKeyPool.erase(it);
        if (!batch.ReadPool(nIndex, keypool)) {
            throw std::runtime_error(std::string(__func__) + ": read failed");
        }
        CPubKey pk;
        if (!GetPubKey(keypool.vchPubKey.GetID(), pk)) {
            throw std::runtime_error(std::string(__func__) + ": unknown key in key pool");
        }
        // If the key was pre-split keypool, we don't care about what type it is
        if (use_split_keypool && keypool.fInternal != fReturningInternal) {
            throw std::runtime_error(std::string(__func__) + ": keypool entry misclassified");
        }
        if (!keypool.vchPubKey.IsValid()) {
            throw std::runtime_error(std::string(__func__) + ": keypool entry invalid");
        }

        assert(m_index_to_reserved_key.count(nIndex) == 0);
        m_index_to_reserved_key[nIndex] = keypool.vchPubKey.GetID();
        m_pool_key_to_index.erase(keypool.vchPubKey.GetID());
        WalletLogPrintf("keypool reserve %d\n", nIndex);
    }
    NotifyCanGetAddressesChanged();
    return true;
}